

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsStructTypes1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (SizedDeclarationsStructTypes1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  ulong *puVar1;
  TestError *this_00;
  long lVar2;
  string example_struct;
  string shader_source;
  
  example_struct._M_dataplus._M_p = (pointer)&example_struct.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&example_struct,
             "struct light {\n    float intensity;\n    int   position;\n};\n\n","");
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  shader_source._M_string_length = 0;
  shader_source.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&shader_source);
  std::__cxx11::string::_M_append((char *)&shader_source,shader_start_abi_cxx11_);
  std::__cxx11::string::append((char *)&shader_source);
  lVar2 = 1;
  do {
    std::__cxx11::string::append((char *)&shader_source);
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  std::__cxx11::string::append((char *)&shader_source);
  puVar1 = &set_tesseation_abi_cxx11_;
  switch((ulong)tested_shader_type) {
  case 0:
  case 2:
  case 5:
    break;
  case 1:
    std::__cxx11::string::append((char *)&shader_source);
    break;
  case 3:
    puVar1 = &emit_quad_abi_cxx11_;
  case 4:
    std::__cxx11::string::_M_append((char *)&shader_source,*puVar1);
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x54f);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
  (*(code *)(&DAT_01aca1a4 + *(int *)(&DAT_01aca1a4 + (ulong)tested_shader_type * 4)))
            (&DAT_01aca1a4 + *(int *)(&DAT_01aca1a4 + (ulong)tested_shader_type * 4),
             empty_string_abi_cxx11_,empty_string_abi_cxx11_,empty_string_abi_cxx11_,
             empty_string_abi_cxx11_,empty_string_abi_cxx11_);
  return;
}

Assistant:

void SizedDeclarationsStructTypes1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string example_struct("struct light {\n"
							   "    float intensity;\n"
							   "    int   position;\n"
							   "};\n\n");
	std::string shader_source;

	for (size_t max_dimension_index = 1; max_dimension_index < API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		shader_source = example_struct;
		shader_source += shader_start;
		shader_source += "    light[2]";

		for (size_t temp_dimension_index = 0; temp_dimension_index < max_dimension_index; temp_dimension_index++)
		{
			shader_source += "[2]";
		}

		shader_source += " x;\n";

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);

	} /* for (int max_dimension_index = 1; ...) */
}